

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::
set_option<asio::detail::socket_option::integer<1,8>>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          integer<1,_8> *option,error_code *ec)

{
  int __fd;
  int __optname;
  uint uVar1;
  int *piVar2;
  ulong *in_RCX;
  integer<1,_8> *in_RDX;
  int *in_RSI;
  error_code eVar3;
  
  __fd = *in_RSI;
  __optname = socket_option::integer<1,_8>::level<asio::ip::udp>(in_RDX,(udp *)(in_RSI + 4));
  uVar1 = socket_option::integer<1,_8>::name<asio::ip::udp>(in_RDX,(udp *)(in_RSI + 4));
  piVar2 = socket_option::integer<1,_8>::data<asio::ip::udp>(in_RDX,(udp *)(in_RSI + 4));
  socket_option::integer<1,_8>::size<asio::ip::udp>(in_RDX,(udp *)(in_RSI + 4));
  socket_ops::setsockopt(__fd,(int)in_RSI + 4,__optname,(void *)(ulong)uVar1,(socklen_t)piVar2);
  eVar3._0_8_ = *in_RCX & 0xffffffff;
  eVar3._M_cat = (error_category *)in_RCX[1];
  return eVar3;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);
    return ec;
  }